

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[6]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  void *__s1;
  StringPtr *__n;
  int iVar2;
  size_t sVar3;
  Maybe<kj::StringPtr_&> MVar4;
  undefined4 extraout_var;
  char *in_RDX;
  long lVar5;
  Iterator iter;
  long local_78;
  long local_70;
  Iterator local_68;
  SearchKey local_50;
  char *local_48;
  undefined1 *local_40;
  
  local_40 = (undefined1 *)&local_78;
  local_48 = params[4] + 4;
  local_78 = *(long *)params;
  local_70 = *(long *)(params[1] + 1) - local_78 >> 4;
  local_50._vptr_SearchKey = (_func_char_7_ **)&PTR_search_002249b8;
  _::BTreeImpl::search(&local_68,(BTreeImpl *)(params[5] + 5),&local_50);
  MVar4.ptr = (StringPtr *)(ulong)local_68.row;
  if ((MVar4.ptr != (StringPtr *)0xe) &&
     (uVar1 = (local_68.leaf)->rows[(long)MVar4.ptr].i, uVar1 != 0)) {
    lVar5 = (ulong)(uVar1 - 1) * 0x10;
    __s1 = *(void **)(local_78 + lVar5);
    __n = *(StringPtr **)(local_78 + 8 + lVar5);
    sVar3 = strlen(in_RDX);
    MVar4.ptr = (StringPtr *)(sVar3 + 1);
    if (__n == MVar4.ptr) {
      if (__n != (StringPtr *)0x0) {
        iVar2 = bcmp(__s1,in_RDX,(size_t)__n);
        MVar4.ptr = (StringPtr *)CONCAT44(extraout_var,iVar2);
        if (iVar2 != 0) goto LAB_0015ef8b;
      }
      lVar5 = lVar5 + *(long *)params;
      goto LAB_0015ef8d;
    }
  }
LAB_0015ef8b:
  lVar5 = 0;
LAB_0015ef8d:
  *(long *)this = lVar5;
  return (Maybe<kj::StringPtr_&>)MVar4.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}